

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip39.c
# Opt level: O2

int bip39_mnemonic_from_bytes(words *w,uchar *bytes,size_t bytes_len,char **output)

{
  size_t mask;
  size_t sVar1;
  char *pcVar2;
  int iVar3;
  words *w_00;
  uchar tmp_bytes [42];
  
  if (output != (char **)0x0) {
    *output = (char *)0x0;
  }
  iVar3 = -2;
  if ((bytes_len != 0 && bytes != (uchar *)0x0) && output != (char **)0x0) {
    w_00 = &en_words;
    if (w != (words *)0x0) {
      w_00 = w;
    }
    if (w_00->bits == 0xb) {
      mask = len_to_mask(bytes_len);
      if (mask != 0) {
        memcpy(tmp_bytes,bytes,bytes_len);
        sVar1 = bip39_checksum(bytes,bytes_len,mask);
        tmp_bytes[bytes_len] = (uchar)sVar1;
        if (0xff < mask) {
          tmp_bytes[bytes_len + 1] = (uchar)(sVar1 >> 8);
          bytes_len = bytes_len + 1;
        }
        pcVar2 = mnemonic_from_bytes(w_00,tmp_bytes,bytes_len + 1);
        *output = pcVar2;
        wally_clear(tmp_bytes,0x2a);
        iVar3 = (uint)(*output != (char *)0x0) * 3 + -3;
      }
    }
  }
  return iVar3;
}

Assistant:

int bip39_mnemonic_from_bytes(const struct words *w,
                              const unsigned char *bytes, size_t bytes_len,
                              char **output)
{
    unsigned char tmp_bytes[BIP39_ENTROPY_LEN_MAX];
    size_t checksum, mask;

    if (output)
        *output = NULL;

    if (!bytes || !bytes_len || !output)
        return WALLY_EINVAL;

    w = w ? w : &en_words;

    if (w->bits != 11u || !(mask = len_to_mask(bytes_len)))
        return WALLY_EINVAL;

    memcpy(tmp_bytes, bytes, bytes_len);
    checksum = bip39_checksum(bytes, bytes_len, mask);
    tmp_bytes[bytes_len] = checksum & 0xff;
    if (mask > 0xff)
        tmp_bytes[++bytes_len] = (checksum >> 8) & 0xff;
    *output = mnemonic_from_bytes(w, tmp_bytes, bytes_len + 1);
    wally_clear(tmp_bytes, sizeof(tmp_bytes));
    return *output ? WALLY_OK : WALLY_ENOMEM;
}